

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf16Dfa.h
# Opt level: O2

Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False> __thiscall
axl::enc::Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False>::decode
          (Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False> *this,uint16_t c)

{
  uint uVar1;
  undefined2 in_register_00000032;
  uint uVar2;
  
  uVar2 = CONCAT22(in_register_00000032,c);
  uVar1 = uVar2 * 0x400 + -0x35fdc00 +
          (this->super_Utf16ReverseDfaTable).
          super_UtfDfa<axl::enc::Utf16ReverseDfaTable,_axl::enc::Utf16CcMap>.m_cp;
  if ((ulong)(byte)Utf16ReverseDfaTable::m_dfa
                   [(uint)(byte)Utf16CcMap::m_map[uVar2 >> 8] +
                    (this->super_Utf16ReverseDfaTable).
                    super_UtfDfa<axl::enc::Utf16ReverseDfaTable,_axl::enc::Utf16CcMap>.m_state] !=
      0x18) {
    uVar1 = uVar2;
  }
  return (Utf16DfaBase<axl::enc::Utf16ReverseDfaTable,_axl::sl::False>)
         ((ulong)uVar1 << 0x20 |
         (ulong)(byte)Utf16ReverseDfaTable::m_dfa
                      [(uint)(byte)Utf16CcMap::m_map[uVar2 >> 8] +
                       (this->super_Utf16ReverseDfaTable).
                       super_UtfDfa<axl::enc::Utf16ReverseDfaTable,_axl::enc::Utf16CcMap>.m_state]);
}

Assistant:

Utf16DfaBase<DfaTable, IsBigEndian>
Utf16DfaBase<DfaTable, IsBigEndian>::decode(uint16_t c) {
	uint_t cc = DfaTable::m_map[IsBigEndian()() ? c & 0xff : c >> 8];
	uint_t nextState = DfaTable::m_dfa[this->m_state + cc];

	if (IsBigEndian()())
		c = sl::swapByteOrder16(c);

	utf32_t cp = nextState == DfaTable::State_ReadyPair ? DfaTable::IsReverse ?
		0x10000 - (0xd800 << 10) - 0xdc00 + (c << 10) + this->m_cp :
		0x10000 - (0xd800 << 10) - 0xdc00 + (this->m_cp << 10) + c :
		c;

	return Utf16DfaBase(nextState, cp);
}